

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

PageHeader * __thiscall duckdb_parquet::PageHeader::operator=(PageHeader *this,PageHeader *other88)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  type tVar4;
  type tVar5;
  type tVar6;
  
  iVar1 = other88->uncompressed_page_size;
  iVar2 = other88->compressed_page_size;
  iVar3 = other88->crc;
  this->type = other88->type;
  this->uncompressed_page_size = iVar1;
  this->compressed_page_size = iVar2;
  this->crc = iVar3;
  tVar4 = (other88->data_page_header).encoding;
  tVar5 = (other88->data_page_header).definition_level_encoding;
  tVar6 = (other88->data_page_header).repetition_level_encoding;
  (this->data_page_header).num_values = (other88->data_page_header).num_values;
  (this->data_page_header).encoding = tVar4;
  (this->data_page_header).definition_level_encoding = tVar5;
  (this->data_page_header).repetition_level_encoding = tVar6;
  Statistics::operator=
            (&(this->data_page_header).statistics,&(other88->data_page_header).statistics);
  (this->data_page_header).__isset = (other88->data_page_header).__isset;
  tVar4 = (other88->dictionary_page_header).encoding;
  (this->dictionary_page_header).num_values = (other88->dictionary_page_header).num_values;
  (this->dictionary_page_header).encoding = tVar4;
  (this->dictionary_page_header).is_sorted = (other88->dictionary_page_header).is_sorted;
  (this->dictionary_page_header).__isset = (other88->dictionary_page_header).__isset;
  DataPageHeaderV2::operator=(&this->data_page_header_v2,&other88->data_page_header_v2);
  this->__isset = other88->__isset;
  return this;
}

Assistant:

PageHeader& PageHeader::operator=(const PageHeader& other88) {
  type = other88.type;
  uncompressed_page_size = other88.uncompressed_page_size;
  compressed_page_size = other88.compressed_page_size;
  crc = other88.crc;
  data_page_header = other88.data_page_header;
  index_page_header = other88.index_page_header;
  dictionary_page_header = other88.dictionary_page_header;
  data_page_header_v2 = other88.data_page_header_v2;
  __isset = other88.__isset;
  return *this;
}